

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

CheckerDeclarationSyntax * __thiscall
slang::parsing::Parser::parseCheckerDeclaration(Parser *this,AttrList attributes)

{
  undefined4 uVar1;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token name_00;
  Token keyword_00;
  Token semi_00;
  Token end_00;
  NamedBlockClauseSyntax *pNVar2;
  AssertionItemPortListSyntax *portList_00;
  CheckerDeclarationSyntax *pCVar3;
  long in_RDI;
  Token TVar4;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> sVar5;
  anon_class_8_1_8991fb9c *in_stack_00000020;
  SyntaxKind in_stack_0000002c;
  Token *in_stack_00000030;
  TokenKind in_stack_0000003e;
  Parser *in_stack_00000040;
  NamedBlockClauseSyntax *blockName;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> members;
  Token end;
  SyntaxKind savedDefinitionKind;
  Token semi;
  AssertionItemPortListSyntax *portList;
  Token name;
  Token keyword;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffe40;
  pointer in_stack_fffffffffffffe48;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe50;
  ParserBase *in_stack_fffffffffffffe60;
  NamedBlockClauseSyntax *in_stack_fffffffffffffe68;
  Parser *in_stack_fffffffffffffe70;
  Info *in_stack_fffffffffffffe80;
  Parser *in_stack_fffffffffffffe98;
  SyntaxFactory in_stack_fffffffffffffea8;
  NamedBlockClauseSyntax *in_stack_fffffffffffffeb0;
  TokenKind in_stack_fffffffffffffece;
  ParserBase *in_stack_fffffffffffffed0;
  SyntaxList<slang::syntax::MemberSyntax> *local_88;
  __extent_storage<18446744073709551615UL> local_80;
  undefined8 local_78;
  Info *local_70;
  undefined1 in_stack_ffffffffffffffa0 [16];
  undefined1 auVar6 [12];
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_00;
  
  auVar6 = in_stack_ffffffffffffffa0._4_12_;
  ParserBase::consume(in_stack_fffffffffffffe60);
  ParserBase::expect(in_stack_fffffffffffffed0,in_stack_fffffffffffffece);
  parseAssertionItemPortList(auVar6._4_8_,auVar6._0_4_);
  TVar4 = ParserBase::expect(in_stack_fffffffffffffed0,in_stack_fffffffffffffece);
  attributes_00 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar4.info;
  uVar1 = *(undefined4 *)(in_RDI + 0x370);
  *(undefined4 *)(in_RDI + 0x370) = 0x45;
  Token::Token((Token *)in_stack_fffffffffffffe40);
  sVar5 = parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseCheckerDeclaration(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__0>
                    (in_stack_00000040,in_stack_0000003e,in_stack_00000030,in_stack_0000002c,
                     in_stack_00000020);
  *(undefined4 *)(in_RDI + 0x370) = uVar1;
  pNVar2 = parseNamedBlockClause(in_stack_fffffffffffffe98);
  TVar4.info = in_stack_fffffffffffffe80;
  TVar4.kind = (short)in_RDI;
  TVar4._2_1_ = (char)((ulong)in_RDI >> 0x10);
  TVar4.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  TVar4.rawLen = (int)((ulong)in_RDI >> 0x20);
  checkBlockNames(in_stack_fffffffffffffe70,TVar4,in_stack_fffffffffffffe68);
  portList_00 = (AssertionItemPortListSyntax *)(in_RDI + 0xe0);
  elements._M_extent._M_extent_value = in_stack_fffffffffffffe50._M_extent_value;
  elements._M_ptr = in_stack_fffffffffffffe48;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (in_stack_fffffffffffffe40,elements);
  local_88 = (SyntaxList<slang::syntax::MemberSyntax> *)sVar5._M_ptr;
  local_80 = sVar5._M_extent._M_extent_value;
  sVar5._M_extent._M_extent_value = in_stack_fffffffffffffe50._M_extent_value;
  sVar5._M_ptr = (pointer)in_stack_fffffffffffffe48;
  slang::syntax::SyntaxList<slang::syntax::MemberSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::MemberSyntax> *)in_stack_fffffffffffffe40,sVar5);
  keyword_00.info = (Info *)in_stack_fffffffffffffe70;
  keyword_00._0_8_ = pNVar2;
  name_00.info = local_70;
  name_00._0_8_ = local_78;
  semi_00.info = local_70;
  semi_00._0_8_ = local_78;
  end_00.info = (Info *)in_stack_fffffffffffffea8.alloc;
  end_00.kind = (short)local_80._M_extent_value;
  end_00._2_1_ = (char)(local_80._M_extent_value >> 0x10);
  end_00.numFlags.raw = (char)(local_80._M_extent_value >> 0x18);
  end_00.rawLen = (int)(local_80._M_extent_value >> 0x20);
  pCVar3 = slang::syntax::SyntaxFactory::checkerDeclaration
                     ((SyntaxFactory *)&stack0xfffffffffffffea8,attributes_00,keyword_00,name_00,
                      portList_00,semi_00,local_88,end_00,in_stack_fffffffffffffeb0);
  return pCVar3;
}

Assistant:

CheckerDeclarationSyntax& Parser::parseCheckerDeclaration(AttrList attributes) {
    auto keyword = consume();
    auto name = expect(TokenKind::Identifier);
    auto portList = parseAssertionItemPortList(SyntaxKind::CheckerDeclaration);
    auto semi = expect(TokenKind::Semicolon);

    auto savedDefinitionKind = currentDefinitionKind;
    currentDefinitionKind = SyntaxKind::CheckerDeclaration;

    Token end;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndCheckerKeyword, end, SyntaxKind::CheckerDeclaration,
        [this](SyntaxKind parentKind, bool& anyLocalModules) {
            return parseMember(parentKind, anyLocalModules);
        });

    currentDefinitionKind = savedDefinitionKind;

    auto blockName = parseNamedBlockClause();
    checkBlockNames(name, blockName);

    return factory.checkerDeclaration(attributes, keyword, name, portList, semi, members, end,
                                      blockName);
}